

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_chunk64(int g_a,int64_t *chunk)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  Integer *chunk_00;
  Integer _ga_work [7];
  Integer aIStack_48 [7];
  
  chunk_00 = aIStack_48;
  IVar1 = pnga_get_dimension((long)g_a);
  if (chunk == (int64_t *)0x0) {
    chunk_00 = (Integer *)0x0;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    if (0 < IVar1) {
      lVar4 = IVar1;
    }
    pIVar2 = aIStack_48 + IVar1;
    for (; pIVar2 = pIVar2 + -1, lVar4 != lVar3; lVar3 = lVar3 + 1) {
      *pIVar2 = chunk[lVar3];
    }
  }
  pnga_set_chunk((long)g_a,chunk_00);
  return;
}

Assistant:

void NGA_Set_chunk64(int g_a, int64_t chunk[])
{
    Integer aa, *ptr, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    if(!chunk)ptr=(Integer*)0;  
    else {
      COPYC2F(chunk,_ga_work, ndim);
      ptr = _ga_work;
    }
    wnga_set_chunk(aa, ptr);
}